

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  Descriptor *pDVar1;
  cpp *field;
  FieldDescriptor *pFVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  FileOptions_OptimizeMode FVar6;
  CType CVar7;
  pointer ppFVar8;
  FieldDescriptor *pFVar9;
  long lVar10;
  FieldGenerator *pFVar11;
  int iVar12;
  FieldDescriptor *pFVar13;
  FieldDescriptor *field_00;
  FieldDescriptor *pFVar14;
  int iVar15;
  ulong uVar16;
  string first_field_name;
  Formatter format;
  string last_field_name;
  RunMap runs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  _Any_data local_148;
  undefined1 local_138 [24];
  undefined1 local_120 [32];
  Printer *local_100;
  undefined1 local_f8 [56];
  code *local_c0 [2];
  undefined1 local_b0 [16];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [3];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pDVar1 = this->descriptor_;
  options = &this->options_;
  local_100 = printer;
  FVar6 = GetOptimizeFor(*(FileDescriptor **)(pDVar1 + 0x10),options,(bool *)0x0);
  if (((FVar6 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar1 + 0x78) != 0)) ||
     (*(int *)(pDVar1 + 4) != 0)) {
    local_f8._0_8_ = local_100;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_f8 + 8),&(this->variables_)._M_t);
    Formatter::operator()<>
              ((Formatter *)local_f8,"void $classname$::InternalSwap($classname$* other) {\n");
    io::Printer::Indent((Printer *)local_f8._0_8_);
    Formatter::operator()<>((Formatter *)local_f8,"using std::swap;\n");
    FVar6 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),options,(bool *)0x0);
    if (FVar6 == FileOptions_OptimizeMode_CODE_SIZE) {
      Formatter::operator()<>((Formatter *)local_f8,"GetReflection()->Swap(this, other);");
    }
    else {
      if (0 < *(int *)(this->descriptor_ + 0x78)) {
        Formatter::operator()<>
                  ((Formatter *)local_f8,"_extensions_.InternalSwap(&other->_extensions_);\n");
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      SetUnknownFieldsVariable
                (this->descriptor_,options,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
      Formatter::AddMap((Formatter *)local_f8,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60);
      local_148._8_8_ = this->descriptor_;
      local_98[0]._M_allocated_capacity._0_4_ = 0;
      local_148._0_4_ = *(undefined4 *)(local_148._8_8_ + 4);
      local_98[0]._8_8_ = local_148._8_8_;
      bVar4 = operator==((Iterator *)local_98,(Iterator *)&local_148);
      if (!bVar4) {
        do {
          pFVar13 = (FieldDescriptor *)
                    (*(long *)(local_98[0]._8_8_ + 0x28) + (long)(int)local_98[0]._0_4_ * 0x48);
          if (*(once_flag **)(pFVar13 + 0x18) != (once_flag *)0x0) {
            local_c0[0] = FieldDescriptor::TypeOnceInit;
            local_120._0_8_ = pFVar13;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar13 + 0x18),local_c0,(FieldDescriptor **)local_120);
          }
          if ((((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar13[2] * 4) == 9) &&
               (CVar7 = EffectiveStringCType(pFVar13,options), CVar7 == FieldOptions_CType_STRING))
              && ((bVar5 = IsStringInlined(pFVar13,options), !bVar5 &&
                  ((~(byte)pFVar13[1] & 0x60) != 0)))) &&
             (((((byte)pFVar13[1] & 0x10) == 0 || (lVar10 = *(long *)(pFVar13 + 0x28), lVar10 == 0))
              || ((*(int *)(lVar10 + 4) == 1 && ((*(byte *)(*(long *)(lVar10 + 0x20) + 1) & 2) != 0)
                  ))))) break;
          local_98[0]._0_4_ = (undefined4)local_98[0]._M_allocated_capacity + 1;
          bVar4 = operator==((Iterator *)local_98,(Iterator *)&local_148);
        } while (!bVar4);
      }
      if (bVar4 == false) {
        Formatter::operator()<>
                  ((Formatter *)local_f8,
                   "auto* lhs_arena = GetArenaForAllocation();\nauto* rhs_arena = other->GetArenaForAllocation();\n"
                  );
      }
      Formatter::operator()<>
                ((Formatter *)local_f8,
                 "_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");
      if (((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (local_98[0]._M_allocated_capacity._0_4_ = 0, 0x3e < this->max_has_bit_index_ + 0x3eU)) {
        do {
          Formatter::operator()
                    ((Formatter *)local_f8,"swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n",
                     (int *)local_98[0]._M_local_buf);
          local_98[0]._0_4_ = (undefined4)local_98[0]._M_allocated_capacity + 1;
          iVar15 = this->max_has_bit_index_ + 0x1f;
          iVar12 = this->max_has_bit_index_ + 0x3e;
          if (-1 < iVar15) {
            iVar12 = iVar15;
          }
        } while ((uint)local_98[0]._0_4_ < (uint)(iVar12 >> 5));
      }
      local_a0 = &this->optimized_order_;
      local_148._8_8_ = 0;
      local_138._8_8_ =
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:3464:36)>
           ::_M_invoke;
      local_138._0_8_ =
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:3464:36)>
           ::_M_manager;
      local_148._M_unused._M_object = this;
      anon_unknown_0::FindRuns
                ((RunMap *)local_98,local_a0,
                 (function<bool_(const_google::protobuf::FieldDescriptor_*)> *)&local_148);
      if ((Descriptor *)local_138._0_8_ != (Descriptor *)0x0) {
        (*(code *)local_138._0_8_)(&local_148,&local_148,3);
      }
      ppFVar8 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->optimized_order_).
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
        uVar16 = 0;
        iVar15 = 0;
        do {
          field = (cpp *)ppFVar8[uVar16];
          pFVar13 = *(FieldDescriptor **)
                     (CONCAT44(local_98[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_98[0]._M_allocated_capacity) +
                     (long)((ulong)field % (ulong)local_98[0]._8_8_) * 8);
          pFVar9 = (FieldDescriptor *)0x0;
          if ((pFVar13 != (FieldDescriptor *)0x0) &&
             (pFVar9 = pFVar13, pFVar14 = *(FieldDescriptor **)pFVar13,
             field != *(cpp **)(*(FieldDescriptor **)pFVar13 + 8))) {
            while (pFVar2 = *(FieldDescriptor **)pFVar14, pFVar2 != (FieldDescriptor *)0x0) {
              pFVar13 = (FieldDescriptor *)((ulong)*(cpp **)(pFVar2 + 8) % (ulong)local_98[0]._8_8_)
              ;
              pFVar9 = (FieldDescriptor *)0x0;
              if ((pFVar13 != (FieldDescriptor *)((ulong)field % (ulong)local_98[0]._8_8_)) ||
                 (pFVar9 = pFVar14, pFVar14 = pFVar2, field == *(cpp **)(pFVar2 + 8)))
              goto LAB_002ad12b;
            }
            pFVar9 = (FieldDescriptor *)0x0;
          }
LAB_002ad12b:
          if (pFVar9 == (FieldDescriptor *)0x0) {
            lVar10 = 0;
          }
          else {
            lVar10 = *(long *)pFVar9;
          }
          if ((lVar10 == 0) || (uVar3 = *(ulong *)(lVar10 + 0x10), uVar3 < 2)) {
            pFVar11 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)field);
            (*pFVar11->_vptr_FieldGenerator[0xe])(pFVar11,local_100);
          }
          else {
            FieldName_abi_cxx11_((string *)&local_148,field,pFVar13);
            FieldName_abi_cxx11_
                      ((string *)local_c0,
                       (cpp *)(local_a0->
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar3 + (uVar16 - 1)],
                       field_00);
            local_120._0_8_ = local_120 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"first","");
            Formatter::Set<std::__cxx11::string>
                      ((Formatter *)local_f8,(string *)local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_148);
            if ((FieldDescriptor *)local_120._0_8_ != (FieldDescriptor *)(local_120 + 0x10)) {
              operator_delete((void *)local_120._0_8_);
            }
            local_120._0_8_ = local_120 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"last","");
            Formatter::Set<std::__cxx11::string>
                      ((Formatter *)local_f8,(string *)local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
            if ((FieldDescriptor *)local_120._0_8_ != (FieldDescriptor *)(local_120 + 0x10)) {
              operator_delete((void *)local_120._0_8_);
            }
            Formatter::operator()<>
                      ((Formatter *)local_f8,
                       "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n    + sizeof($classname$::$last$_)\n    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n        reinterpret_cast<char*>(&$first$_),\n        reinterpret_cast<char*>(&other->$first$_));\n"
                      );
            if (local_c0[0] != (code *)local_b0) {
              operator_delete(local_c0[0]);
            }
            if ((MessageGenerator *)local_148._M_unused._0_8_ != (MessageGenerator *)local_138) {
              operator_delete(local_148._M_unused._M_object);
            }
            iVar15 = iVar15 + (int)uVar3 + -1;
          }
          iVar15 = iVar15 + 1;
          uVar16 = (ulong)iVar15;
          ppFVar8 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar16 < (ulong)((long)(this->optimized_order_).
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8
                                 >> 3));
      }
      local_148._8_8_ = this->descriptor_;
      local_148._M_unused._M_member_pointer =
           local_148._M_unused._M_member_pointer & 0xffffffff00000000;
      local_c0[0] = (code *)CONCAT44(local_c0[0]._4_4_,*(undefined4 *)(local_148._8_8_ + 0x6c));
      local_c0[1] = (code *)local_148._8_8_;
      while (bVar4 = operator==((Iterator *)&local_148,(Iterator *)local_c0), !bVar4) {
        Formatter::operator()
                  ((Formatter *)local_f8,"swap($1$_, other->$1$_);\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(local_148._8_8_ + 0x30) + 8 + (long)(int)local_148._0_4_ * 0x28));
        local_148._0_4_ = local_148._0_4_ + 1;
      }
      local_148._M_unused._M_member_pointer =
           local_148._M_unused._M_member_pointer & 0xffffffff00000000;
      if (0 < *(int *)(this->descriptor_ + 0x6c)) {
        do {
          Formatter::operator()
                    ((Formatter *)local_f8,"swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n",
                     (int *)local_148._M_pod_data);
          iVar15 = local_148._0_4_ + 1;
          local_148._0_4_ = iVar15;
        } while (iVar15 < *(int *)(this->descriptor_ + 0x6c));
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  ((Formatter *)local_f8,
                   "_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
      }
      std::
      _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_98);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
    }
    io::Printer::Outdent((Printer *)local_f8._0_8_);
    Formatter::operator()<>((Formatter *)local_f8,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_f8 + 8));
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSwap(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  format("void $classname$::InternalSwap($classname$* other) {\n");
  format.Indent();
  format("using std::swap;\n");

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    if (descriptor_->extension_range_count() > 0) {
      format("_extensions_.InternalSwap(&other->_extensions_);\n");
    }

    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    if (HasSingularString(descriptor_, options_)) {
      format(
          "auto* lhs_arena = GetArenaForAllocation();\n"
          "auto* rhs_arena = other->GetArenaForAllocation();\n");
    }
    format("_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");

    if (!has_bit_indices_.empty()) {
      for (int i = 0; i < HasBitsSize(); ++i) {
        format("swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n", i);
      }
    }

    // If possible, we swap several fields at once, including padding.
    const RunMap runs =
        FindRuns(optimized_order_, [this](const FieldDescriptor* field) {
          return CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_);
        });

    for (int i = 0; i < optimized_order_.size(); ++i) {
      const FieldDescriptor* field = optimized_order_[i];
      const auto it = runs.find(field);

      // We only apply the memswap technique to runs of more than one field, as
      // `swap(field_, other.field_)` is better than
      // `memswap<...>(&field_, &other.field_)` for generated code readability.
      if (it != runs.end() && it->second > 1) {
        // Use a memswap, then skip run_length fields.
        const size_t run_length = it->second;
        const std::string first_field_name = FieldName(field);
        const std::string last_field_name =
            FieldName(optimized_order_[i + run_length - 1]);

        format.Set("first", first_field_name);
        format.Set("last", last_field_name);

        format(
            "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n"
            "    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n"
            "    + sizeof($classname$::$last$_)\n"
            "    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n"
            "        reinterpret_cast<char*>(&$first$_),\n"
            "        reinterpret_cast<char*>(&other->$first$_));\n");

        i += run_length - 1;
        // ++i at the top of the loop.
      } else {
        field_generators_.get(field).GenerateSwappingCode(printer);
      }
    }

    for (auto oneof : OneOfRange(descriptor_)) {
      format("swap($1$_, other->$1$_);\n", oneof->name());
    }

    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      format("swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n", i);
    }

    if (num_weak_fields_) {
      format("_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
    }
  } else {
    format("GetReflection()->Swap(this, other);");
  }

  format.Outdent();
  format("}\n");
}